

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heapmanager.h
# Opt level: O3

void __thiscall
Hoard::HeapManager<HL::SpinLockType,_Hoard::HoardHeap<2048,_128>_>::releaseHeap
          (HeapManager<HL::SpinLockType,_Hoard::HoardHeap<2048,_128>_> *this)

{
  __int_type _Var1;
  pthread_t pVar2;
  
  LOCK();
  _Var1 = (this->heapLock)._mutex._M_base._M_i;
  (this->heapLock)._mutex._M_base._M_i = true;
  UNLOCK();
  if ((_Var1 & 1U) != 0) {
    HL::SpinLockType::contendedLock(&this->heapLock);
  }
  pVar2 = pthread_self();
  *(undefined4 *)
   ((long)(this->super_HoardHeap<2048,_128>).
          super_ANSIWrapper<Hoard::IgnoreInvalidFree<HL::HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>_>_>
          .
          super_IgnoreInvalidFree<HL::HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>_>
          .
          super_HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
          .super_ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>._inUseMap._item +
   (long)*(int *)((long)(this->super_HoardHeap<2048,_128>).
                        super_ANSIWrapper<Hoard::IgnoreInvalidFree<HL::HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>_>_>
                        .
                        super_IgnoreInvalidFree<HL::HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>_>
                        .
                        super_HybridHeap<32768,_Hoard::ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>,_Hoard::BigHeap>
                        .super_ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>._tidMap._item +
                 (ulong)((uint)(pVar2 >> 10) & 0x1ffc)) * 4) = 0;
  LOCK();
  (this->heapLock)._mutex._M_base._M_i = false;
  UNLOCK();
  return;
}

Assistant:

void releaseHeap() {
      // Decrement the ref-count on the current heap.
      
      std::lock_guard<LockType> g (heapLock);
      
      // Statically ensure that the number of threads is a power of two.
      enum { VerifyPowerOfTwo = 1 / ((HeapType::MaxThreads & ~(HeapType::MaxThreads-1))) };
      
      auto tid = (int) (HL::CPUInfo::getThreadId() & (HeapType::MaxThreads - 1));
      auto heapIndex = HeapType::getTidMap (tid);
      
      HeapType::setInusemap (heapIndex, 0);
      
      // Prevent underruns (defensive programming).
      
      if (HeapType::getInusemap (heapIndex) < 0) {
	HeapType::setInusemap (heapIndex, 0);
      }
    }